

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<unsigned_long_long,_long_long,_3>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long_long *t,longlong *u,unsigned_long_long *result)

{
  ulong uVar1;
  ulong t_00;
  
  t_00 = *u;
  if (t_00 != 0) {
    uVar1 = *t;
    if ((long)t_00 < 0) {
      t_00 = AbsValueHelper<long_long,_1>::Abs(t_00);
    }
    *result = uVar1 % t_00;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        // u could be negative - if so, need to convert to positive
        if(u < 0)
            result = (T)(t % AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ));
        else
            result = (T)(t % u);
    }